

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int read_children(archive_read *a,file_info *parent)

{
  iso9660 *iso9660_00;
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  size_t min;
  file_info *file;
  uint64_t *puVar4;
  content *con;
  file_info *child;
  int64_t skipsize;
  size_t skip_size;
  size_t step;
  file_info *multi;
  uchar *p;
  uchar *b;
  iso9660 *iso9660;
  file_info *parent_local;
  archive_read *a_local;
  
  iso9660_00 = (iso9660 *)a->format->data;
  if (iso9660_00->entry_bytes_unconsumed != 0) {
    __archive_read_consume(a,iso9660_00->entry_bytes_unconsumed);
    iso9660_00->entry_bytes_unconsumed = 0;
  }
  if (parent->offset < iso9660_00->current_position) {
    archive_set_error(&a->archive,-1,"Ignoring out-of-order directory (%s) %jd > %jd",
                      (parent->name).s,iso9660_00->current_position,parent->offset);
    a_local._4_4_ = -0x14;
  }
  else if (iso9660_00->volume_size < parent->offset + parent->size) {
    archive_set_error(&a->archive,-1,"Directory is beyond end-of-media: %s",(parent->name).s);
    a_local._4_4_ = -0x14;
  }
  else {
    if (iso9660_00->current_position < parent->offset) {
      iVar3 = __archive_read_consume(a,parent->offset - iso9660_00->current_position);
      if (iVar3 < 0) {
        return (int)iVar3;
      }
      iso9660_00->current_position = parent->offset;
    }
    min = (((parent->size + iso9660_00->logical_block_size) - 1) /
          (ulong)iso9660_00->logical_block_size) * iso9660_00->logical_block_size;
    p = (uchar *)__archive_read_ahead(a,min,(ssize_t *)0x0);
    if (p == (uchar *)0x0) {
      archive_set_error(&a->archive,-1,
                        "Failed to read full block when scanning ISO9660 directory list");
      a_local._4_4_ = -0x1e;
    }
    else {
      iso9660_00->current_position = min + iso9660_00->current_position;
      step = 0;
      skip_size = min;
      while (skip_size != 0) {
        multi = (file_info *)p;
        p = p + iso9660_00->logical_block_size;
        skip_size = skip_size - iso9660_00->logical_block_size;
        while( true ) {
          bVar1 = false;
          if ((*(char *)&multi->use_next != '\0') && (bVar1 = false, multi < p)) {
            bVar1 = (file_info *)
                    ((long)&multi->use_next + (long)(int)(uint)*(byte *)&multi->use_next) <= p;
          }
          if (!bVar1) break;
          if ((((char)multi->subdirs != '\x01') || (*(char *)((long)&multi->subdirs + 1) != '\0'))
             && (((char)multi->subdirs != '\x01' || (*(char *)((long)&multi->subdirs + 1) != '\x01')
                 ))) {
            file = parse_file_info(a,parent,(uchar *)multi);
            if (file == (file_info *)0x0) {
              __archive_read_consume(a,min);
              return -0x1e;
            }
            if ((file->cl_offset == 0) && ((file->multi_extent != 0 || (step != 0)))) {
              if (step == 0) {
                (file->contents).first = (content *)0x0;
                (file->contents).last = &(file->contents).first;
                step = (size_t)file;
              }
              puVar4 = (uint64_t *)malloc(0x18);
              if (puVar4 == (uint64_t *)0x0) {
                archive_set_error(&a->archive,0xc,"No memory for multi extent");
                __archive_read_consume(a,min);
                return -0x1e;
              }
              *puVar4 = file->offset;
              puVar4[1] = file->size;
              puVar4[2] = 0;
              **(undefined8 **)(step + 0x118) = puVar4;
              *(uint64_t **)(step + 0x118) = puVar4 + 2;
              if ((file_info *)step == file) {
                iVar2 = heap_add_entry(a,&iso9660_00->pending_files,file,file->offset);
                if (iVar2 != 0) {
                  return -0x1e;
                }
              }
              else {
                *(uint64_t *)(step + 0x38) = file->size + *(long *)(step + 0x38);
                if (file->multi_extent == 0) {
                  step = 0;
                }
              }
            }
            else {
              iVar2 = heap_add_entry(a,&iso9660_00->pending_files,file,file->offset);
              if (iVar2 != 0) {
                return -0x1e;
              }
            }
          }
          multi = (file_info *)((long)&multi->use_next + (long)(int)(uint)*(byte *)&multi->use_next)
          ;
        }
      }
      __archive_read_consume(a,min);
      iVar2 = read_CE(a,iso9660_00);
      if (iVar2 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        a_local._4_4_ = -0x1e;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
read_children(struct archive_read *a, struct file_info *parent)
{
	struct iso9660 *iso9660;
	const unsigned char *b, *p;
	struct file_info *multi;
	size_t step, skip_size;

	iso9660 = (struct iso9660 *)(a->format->data);
	/* flush any remaining bytes from the last round to ensure
	 * we're positioned */
	if (iso9660->entry_bytes_unconsumed) {
		__archive_read_consume(a, iso9660->entry_bytes_unconsumed);
		iso9660->entry_bytes_unconsumed = 0;
	}
	if (iso9660->current_position > parent->offset) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Ignoring out-of-order directory (%s) %jd > %jd",
		    parent->name.s,
		    (intmax_t)iso9660->current_position,
		    (intmax_t)parent->offset);
		return (ARCHIVE_WARN);
	}
	if (parent->offset + parent->size > iso9660->volume_size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Directory is beyond end-of-media: %s",
		    parent->name.s);
		return (ARCHIVE_WARN);
	}
	if (iso9660->current_position < parent->offset) {
		int64_t skipsize;

		skipsize = parent->offset - iso9660->current_position;
		skipsize = __archive_read_consume(a, skipsize);
		if (skipsize < 0)
			return ((int)skipsize);
		iso9660->current_position = parent->offset;
	}

	step = (size_t)(((parent->size + iso9660->logical_block_size -1) /
	    iso9660->logical_block_size) * iso9660->logical_block_size);
	b = __archive_read_ahead(a, step, NULL);
	if (b == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to read full block when scanning "
		    "ISO9660 directory list");
		return (ARCHIVE_FATAL);
	}
	iso9660->current_position += step;
	multi = NULL;
	skip_size = step;
	while (step) {
		p = b;
		b += iso9660->logical_block_size;
		step -= iso9660->logical_block_size;
		for (; *p != 0 && p < b && p + *p <= b; p += *p) {
			struct file_info *child;

			/* N.B.: these special directory identifiers
			 * are 8 bit "values" even on a
			 * Joliet CD with UCS-2 (16bit) encoding.
			 */

			/* Skip '.' entry. */
			if (*(p + DR_name_len_offset) == 1
			    && *(p + DR_name_offset) == '\0')
				continue;
			/* Skip '..' entry. */
			if (*(p + DR_name_len_offset) == 1
			    && *(p + DR_name_offset) == '\001')
				continue;
			child = parse_file_info(a, parent, p);
			if (child == NULL) {
				__archive_read_consume(a, skip_size);
				return (ARCHIVE_FATAL);
			}
			if (child->cl_offset == 0 &&
			    (child->multi_extent || multi != NULL)) {
				struct content *con;

				if (multi == NULL) {
					multi = child;
					multi->contents.first = NULL;
					multi->contents.last =
					    &(multi->contents.first);
				}
				con = malloc(sizeof(struct content));
				if (con == NULL) {
					archive_set_error(
					    &a->archive, ENOMEM,
					    "No memory for multi extent");
					__archive_read_consume(a, skip_size);
					return (ARCHIVE_FATAL);
				}
				con->offset = child->offset;
				con->size = child->size;
				con->next = NULL;
				*multi->contents.last = con;
				multi->contents.last = &(con->next);
				if (multi == child) {
					if (add_entry(a, iso9660, child)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				} else {
					multi->size += child->size;
					if (!child->multi_extent)
						multi = NULL;
				}
			} else
				if (add_entry(a, iso9660, child) != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
		}
	}

	__archive_read_consume(a, skip_size);

	/* Read data which recorded by RRIP "CE" extension. */
	if (read_CE(a, iso9660) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	return (ARCHIVE_OK);
}